

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ptrmapPutOvflPtr(MemPage *pPage,MemPage *pSrc,u8 *pCell,int *pRC)

{
  uint uVar1;
  CellInfo info;
  CellInfo local_40;
  
  if (*pRC != 0) {
    return;
  }
  (*pPage->xParseCell)(pPage,pCell,&local_40);
  if (local_40.nLocal < local_40.nPayload) {
    if ((pSrc->aDataEnd < pCell) || (pCell + local_40.nLocal <= pSrc->aDataEnd)) {
      uVar1 = *(uint *)(pCell + ((ulong)local_40.nSize - 4));
      ptrmapPut(pPage->pBt,
                uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18,
                '\x03',pPage->pgno,pRC);
    }
    else {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10fac,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      *pRC = 0xb;
    }
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, MemPage *pSrc, u8 *pCell,int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl;
    if( SQLITE_WITHIN(pSrc->aDataEnd, pCell, pCell+info.nLocal) ){
      testcase( pSrc!=pPage );
      *pRC = SQLITE_CORRUPT_BKPT;
      return;
    }
    ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}